

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

void alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
     build_model_sampling(V *values,int num_keys,LinearModel<int> *model,bool verbose)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  ostream *poVar5;
  long lVar6;
  int y;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double local_f8;
  double local_e8;
  LinearModelBuilder<int> local_a8;
  
  if (num_keys < 0x15) {
    build_model(values,num_keys,model,false);
    return;
  }
  uVar8 = 1;
  for (dVar11 = (double)num_keys; 10.0 <= dVar11; dVar11 = dVar11 * 0.5) {
    uVar8 = uVar8 * 2;
  }
  uVar9 = (ulong)(uVar8 >> 1);
  local_a8.count_ = 0;
  local_a8.x_sum_ = (longdouble)0;
  local_a8.x_min_ = 0x7fffffff;
  local_a8.x_max_ = -0x80000000;
  local_a8.y_min_ = 1.79769313486232e+308;
  local_a8.y_max_ = -1.79769313486232e+308;
  local_a8.model_ = model;
  local_a8.y_sum_ = local_a8.x_sum_;
  local_a8.xx_sum_ = local_a8.x_sum_;
  local_a8.xy_sum_ = local_a8.x_sum_;
  for (uVar7 = 0; uVar7 < (uint)num_keys; uVar7 = uVar7 + uVar9) {
    LinearModelBuilder<int>::add(&local_a8,values[uVar7].first,(int)uVar7);
  }
  LinearModelBuilder<int>::build(&local_a8);
  local_e8 = model->b_;
  dVar11 = model->a_;
  if (verbose) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Build index, sample size: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)num_keys / (uVar8 >> 1));
    std::operator<<(poVar5," (a, b): (");
    poVar5 = std::ostream::_M_insert<double>(dVar11);
    std::operator<<(poVar5,", ");
    poVar5 = std::ostream::_M_insert<double>(local_e8);
    poVar5 = std::operator<<(poVar5,")");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  do {
    if ((uint)uVar9 < 2) {
      return;
    }
    uVar8 = (uint)uVar9 >> 1;
    uVar9 = (ulong)uVar8;
    y = 0;
    while (y < num_keys) {
      lVar6 = (long)y;
      bVar4 = true;
      while( true ) {
        y = y + uVar8;
        lVar6 = lVar6 + uVar9;
        if ((!bVar4) || ((long)(ulong)(uint)num_keys <= lVar6)) break;
        LinearModelBuilder<int>::add(&local_a8,values[lVar6].first,y);
        bVar4 = false;
      }
    }
    LinearModelBuilder<int>::build(&local_a8);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = model->a_;
    if ((dVar11 != 0.0) || (NAN(dVar11))) {
      auVar12._0_8_ = (model->a_ - dVar11) / dVar11;
      auVar12._8_8_ = 0;
      auVar1._8_8_ = 0x7fffffffffffffff;
      auVar1._0_8_ = 0x7fffffffffffffff;
      auVar10 = vandpd_avx512vl(auVar12,auVar1);
      dVar11 = auVar10._0_8_;
    }
    else {
      uVar2 = vcmpsd_avx512f(auVar10,ZEXT816(0) << 0x40,4);
      dVar11 = (double)((ulong)((byte)uVar2 & 1) * 0x3ff0000000000000);
    }
    auVar3._8_8_ = 0x7fffffffffffffff;
    auVar3._0_8_ = 0x7fffffffffffffff;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = model->b_ - local_e8;
    auVar10 = vandpd_avx(auVar13,auVar3);
    auVar14._0_8_ = auVar10._0_8_ / local_e8;
    auVar14._8_8_ = auVar10._8_8_;
    auVar1 = vandpd_avx(auVar14,auVar3);
    local_f8 = auVar1._0_8_;
    if (verbose) {
      poVar5 = std::operator<<((ostream *)&std::cout,"Build index, sample size: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(uint)num_keys / uVar8);
      std::operator<<(poVar5," (a, b): (");
      poVar5 = std::ostream::_M_insert<double>(model->a_);
      std::operator<<(poVar5,", ");
      poVar5 = std::ostream::_M_insert<double>(model->b_);
      std::operator<<(poVar5,") (");
      poVar5 = std::ostream::_M_insert<double>(dVar11);
      std::operator<<(poVar5,", ");
      poVar5 = std::ostream::_M_insert<double>(local_f8);
      poVar5 = std::operator<<(poVar5,")");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    if (dVar11 < 0.01) {
      if (auVar10._0_8_ < 0.5) {
        return;
      }
      if (local_f8 < 0.01) {
        return;
      }
    }
    local_e8 = model->b_;
    dVar11 = model->a_;
  } while( true );
}

Assistant:

static void build_model_sampling(const V* values, int num_keys,
                                   LinearModel<T>* model,
                                   bool verbose = false) {
    const static int sample_size_lower_bound = 10;
    // If slope and intercept change by less than this much between samples,
    // return
    const static double rel_change_threshold = 0.01;
    // If intercept changes by less than this much between samples, return
    const static double abs_change_threshold = 0.5;
    // Increase sample size by this many times each iteration
    const static int sample_size_multiplier = 2;

    // If the number of keys is sufficiently small, we do not sample
    if (num_keys <= sample_size_lower_bound * sample_size_multiplier) {
      build_model(values, num_keys, model, false);
      return;
    }

    int step_size = 1;
    double sample_size = num_keys;
    while (sample_size >= sample_size_lower_bound) {
      sample_size /= sample_size_multiplier;
      step_size *= sample_size_multiplier;
    }
    step_size /= sample_size_multiplier;

    // Run with initial step size
    LinearModelBuilder<T> builder(model);
    for (int i = 0; i < num_keys; i += step_size) {
      builder.add(values[i].first, i);
    }
    builder.build();
    double prev_a = model->a_;
    double prev_b = model->b_;
    if (verbose) {
      std::cout << "Build index, sample size: " << num_keys / step_size
                << " (a, b): (" << prev_a << ", " << prev_b << ")" << std::endl;
    }

    // Keep decreasing step size (increasing sample size) until model does not
    // change significantly
    while (step_size > 1) {
      step_size /= sample_size_multiplier;
      // Need to avoid processing keys we already processed in previous samples
      int i = 0;
      while (i < num_keys) {
        i += step_size;
        for (int j = 1; (j < sample_size_multiplier) && (i < num_keys);
             j++, i += step_size) {
          builder.add(values[i].first, i);
        }
      }
      builder.build();

      double rel_change_in_a = prev_a == 0 ? (model->a_ != 0) 
                               : std::abs((model->a_ - prev_a) / prev_a);
      double abs_change_in_b = std::abs(model->b_ - prev_b);
      double rel_change_in_b = std::abs(abs_change_in_b / prev_b);
      if (verbose) {
        std::cout << "Build index, sample size: " << num_keys / step_size
                  << " (a, b): (" << model->a_ << ", " << model->b_ << ") ("
                  << rel_change_in_a << ", " << rel_change_in_b << ")"
                  << std::endl;
      }
      if (rel_change_in_a < rel_change_threshold &&
          (rel_change_in_b < rel_change_threshold ||
           abs_change_in_b < abs_change_threshold)) {
        return;
      }
      prev_a = model->a_;
      prev_b = model->b_;
    }
  }